

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O0

void __thiscall QFbCursor::setPos(QFbCursor *this,QPoint *pos)

{
  QPoint *pQVar1;
  QPoint p;
  long *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QRect *this_00;
  byte local_69;
  QFbCursor *in_stack_ffffffffffffffb8;
  QRect *in_stack_ffffffffffffffc8;
  undefined1 local_28 [16];
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QPoint *)QGuiApplicationPrivate::inputDeviceManager();
  QInputDeviceManager::setCursorPos(pQVar1);
  in_RDI[0xb] = *in_RSI;
  if ((*(byte *)(in_RDI + 2) & 1) != 0) {
    local_18 = getCurrentRect(in_stack_ffffffffffffffb8);
    in_RDI[4] = local_18._0_8_;
    in_RDI[5] = local_18._8_8_;
    local_69 = 1;
    if ((*(byte *)((long)in_RDI + 0x41) & 1) == 0) {
      local_28 = (**(code **)(*(long *)in_RDI[3] + 0x68))();
      this_00 = (QRect *)(in_RDI + 4);
      (**(code **)(*(long *)in_RDI[3] + 0x68))();
      p = QRect::topLeft(this_00);
      QRect::translated(in_stack_ffffffffffffffc8,(QPoint *)p);
      local_69 = QRect::intersects((QRect *)local_28);
    }
    if ((local_69 & 1) != 0) {
      (**(code **)(*in_RDI + 0xa0))();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFbCursor::setPos(const QPoint &pos)
{
    QGuiApplicationPrivate::inputDeviceManager()->setCursorPos(pos);
    m_pos = pos;
    if (!mVisible)
        return;
    mCurrentRect = getCurrentRect();
    if (mOnScreen || mScreen->geometry().intersects(mCurrentRect.translated(mScreen->geometry().topLeft())))
        setDirty();
}